

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

void test_receive_fragmented_frames(void)

{
  uint length;
  uint length_00;
  cio_websocket_frame_type cVar1;
  frame_direction fVar2;
  cio_websocket *websocket;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  cio_error cVar6;
  ulong __size;
  ulong __size_00;
  void *__s;
  void *__s_00;
  long lVar7;
  long lVar8;
  uint uVar9;
  UNITY_UINT lineNumber;
  char *msg;
  long lVar10;
  ulong actual;
  ulong expected;
  ulong uVar11;
  ws_frame local_98;
  undefined4 local_78;
  frame_direction local_74;
  void *local_70;
  ulong local_68;
  undefined2 local_60;
  undefined4 local_58;
  frame_direction local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined2 local_40;
  
  lVar8 = 0;
  do {
    length = (&DAT_00111ff0)[lVar8];
    __size = (ulong)length;
    lVar7 = 0;
    do {
      length_00 = (&DAT_00111ff0)[lVar7];
      __size_00 = (ulong)length_00;
      uVar11 = 0;
      bVar3 = true;
      do {
        bVar4 = bVar3;
        cVar1 = (&DAT_00112080)[uVar11];
        lVar10 = 0;
        bVar3 = true;
        do {
          bVar5 = bVar3;
          fVar2 = (&DAT_00112088)[lVar10];
          __s = malloc(__size);
          memset(__s,0x61,__size);
          __s_00 = malloc(__size_00);
          memset(__s_00,0x62,__size_00);
          local_98.last_frame = false;
          local_98.rsv = false;
          local_78 = 0;
          local_60 = 1;
          local_58 = 8;
          local_50 = 0;
          uStack_48 = 0;
          local_40 = 1;
          local_98.frame_type = cVar1;
          local_98.direction = fVar2;
          local_98.data = __s;
          local_98.data_length = __size;
          local_74 = fVar2;
          local_70 = __s_00;
          local_68 = __size_00;
          local_54 = fVar2;
          serialize_frames(&local_98,3);
          websocket = ws;
          *(ushort *)&(ws->ws_private).ws_flags =
               (SUB42((ws->ws_private).ws_flags,0) & 0xfbff | (ushort)((int)lVar10 << 10)) ^ 0x400;
          cVar6 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
          UnityAssertEqualNumber
                    (0,(long)cVar6,"Could not start reading a message!",0x30f,
                     UNITY_DISPLAY_STYLE_INT);
          UnityAssertGreaterOrLessOrEqualNumber
                    (3,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
                     "read_handler was not called",0x311,UNITY_DISPLAY_STYLE_INT);
          uVar9 = read_handler_fake.call_count;
          if (read_handler_fake.arg_history_len < read_handler_fake.call_count) {
            uVar9 = read_handler_fake.arg_history_len;
          }
          if (uVar9 != 0) {
            uVar9 = read_handler_fake.arg_history_len;
            if (read_handler_fake.call_count < read_handler_fake.arg_history_len) {
              uVar9 = read_handler_fake.call_count;
            }
            lVar10 = 0;
            do {
              UnityAssertEqualNumber
                        ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[lVar10],
                         "websocket parameter of read_handler not correct",0x314,
                         UNITY_DISPLAY_STYLE_INT);
              if (read_handler_fake.arg1_history[lVar10] != (void *)0x0) {
                UnityFail("context parameter of read handler not NULL",0x315);
              }
              actual = (ulong)read_handler_fake.arg2_history[lVar10];
              if ((uint)lVar10 < read_handler_fake.call_count - 1) {
                UnityAssertEqualNumber
                          (0,actual,"error parameter of read_handler not CIO_SUCCESS",0x317,
                           UNITY_DISPLAY_STYLE_INT);
                if (((uint)lVar10 == 0) && (read_handler_fake.arg7_history[lVar10] == true)) {
                  UnityFail("last_frame parameter of read_handler for first fragment not false",
                            0x319);
                }
                actual = (ulong)read_handler_fake.arg8_history[lVar10];
                lineNumber = 0x31b;
                msg = "is_binary parameter of read_handler for first fragment not correct";
                expected = uVar11 ^ 1;
              }
              else {
                expected = 1;
                lineNumber = 0x31d;
                msg = "err parameter of read_handler not correct";
              }
              UnityAssertEqualNumber(expected,actual,msg,lineNumber,UNITY_DISPLAY_STYLE_INT);
              lVar10 = lVar10 + 1;
            } while (uVar9 != (uint)lVar10);
          }
          UnityAssertEqualNumber
                    (0,(ulong)on_error_fake.call_count,"error callback was called",0x321,
                     UNITY_DISPLAY_STYLE_INT);
          if (lVar8 != 0) {
            UnityAssertEqualMemory
                      (__s,read_back_buffer,length,1,
                       "data in data/binaray frame callback not correct",0x323,UNITY_ARRAY_TO_ARRAY)
            ;
            if (lVar7 != 0) {
              UnityAssertEqualMemory
                        (__s_00,read_back_buffer + __size,length_00,1,
                         "data in data/binaray frame callback not correct",0x325,
                         UNITY_ARRAY_TO_ARRAY);
            }
          }
          UnityAssertEqualNumber
                    (1,(ulong)on_control_fake.call_count,
                     "control callback was not called for last close frame",0x329,
                     UNITY_DISPLAY_STYLE_INT);
          if (on_control_fake.arg0_val == (cio_websocket *)0x0) {
            UnityFail("websocket parameter of control callback is NULL",0x32a);
          }
          UnityAssertEqualNumber
                    (8,(ulong)on_control_fake.arg1_val,
                     "websocket parameter of control callback is NULL",0x32b,UNITY_DISPLAY_STYLE_INT
                    );
          if (on_control_fake.arg2_val != (uint8_t *)0x0) {
            UnityFail("data parameter of control callback is not correct",0x32c);
          }
          UnityAssertEqualNumber
                    (0,(ulong)on_control_fake.arg3_val,
                     "data length parameter of control callback is not correct",0x32d,
                     UNITY_DISPLAY_STYLE_INT);
          free(ws);
          free(__s);
          free(__s_00);
          setUp();
          lVar10 = 1;
          bVar3 = false;
        } while (bVar5);
        uVar11 = 1;
        bVar3 = false;
      } while (bVar4);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
    lVar8 = lVar8 + 1;
    if (lVar8 == 7) {
      return;
    }
  } while( true );
}

Assistant:

static void test_receive_fragmented_frames(void)
{
	uint32_t first_frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	uint32_t second_frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction dirs[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(first_frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(second_frame_sizes); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(frame_types); k++) {
				for (unsigned int l = 0; l < ARRAY_SIZE(dirs); l++) {
					unsigned int frame_type = frame_types[k];
					uint32_t first_frame_size = first_frame_sizes[i];
					uint32_t second_frame_size = second_frame_sizes[j];
					enum frame_direction dir = dirs[l];

					char *first_data = malloc(first_frame_size);
					memset(first_data, 'a', first_frame_size);

					char *last_data = malloc(second_frame_size);
					memset(last_data, 'b', second_frame_size);
					struct ws_frame frames[] = {
					    {.frame_type = frame_type, .direction = dir, .data = first_data, .data_length = first_frame_size, .last_frame = false},
					    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = dir, .data = last_data, .data_length = second_frame_size, .last_frame = true, .rsv = false},
					    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = dir, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
					};

					serialize_frames(frames, ARRAY_SIZE(frames));

					ws->ws_private.ws_flags.is_server = (dir == FROM_CLIENT) ? 1 : 0;
					enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

					TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(3, read_handler_fake.call_count, "read_handler was not called");
					unsigned int arg_history_counter = CIO_MIN(read_handler_fake.arg_history_len, read_handler_fake.call_count);
					for (unsigned int read_cnt = 0; read_cnt < arg_history_counter; read_cnt++) {
						TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_history[read_cnt], "websocket parameter of read_handler not correct");
						TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_cnt], "context parameter of read handler not NULL");
						if (read_cnt < read_handler_fake.call_count - 1) {
							TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[read_cnt], "error parameter of read_handler not CIO_SUCCESS");
							if (read_cnt == 0) {
								TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg7_history[read_cnt], "last_frame parameter of read_handler for first fragment not false");
							}
							TEST_ASSERT_EQUAL_MESSAGE((frame_type == CIO_WEBSOCKET_BINARY_FRAME), read_handler_fake.arg8_history[read_cnt], "is_binary parameter of read_handler for first fragment not correct");
						} else {
							TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_cnt], "err parameter of read_handler not correct");
						}
					}

					TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
					if (first_frame_size > 0) {
						TEST_ASSERT_EQUAL_MEMORY_MESSAGE(first_data, read_back_buffer, first_frame_size, "data in data/binaray frame callback not correct");
						if (second_frame_size > 0) {
							TEST_ASSERT_EQUAL_MEMORY_MESSAGE(last_data, &read_back_buffer[first_frame_size], second_frame_size, "data in data/binaray frame callback not correct");
						}
					}

					TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was not called for last close frame");
					TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_val, "websocket parameter of control callback is NULL");
					TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "websocket parameter of control callback is NULL");
					TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_val, "data parameter of control callback is not correct");
					TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_val, "data length parameter of control callback is not correct");

					free(ws);
					free(first_data);
					free(last_data);
					setUp();
				}
			}
		}
	}
}